

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix4.cpp
# Opt level: O2

Matrix4 * __thiscall
COLLADABU::Math::Matrix4::adjoint(Matrix4 *__return_storage_ptr__,Matrix4 *this)

{
  Real RVar1;
  Real RVar2;
  Real RVar3;
  Real RVar4;
  Real RVar5;
  Real RVar6;
  Real RVar7;
  Real RVar8;
  Real RVar9;
  Real RVar10;
  Real RVar11;
  Real RVar12;
  Real RVar13;
  Real RVar14;
  Real RVar15;
  Real RVar16;
  undefined4 local_88;
  uint uStack_84;
  undefined4 local_48;
  uint uStack_44;
  
  RVar1 = MINOR(this,1,2,3,1,2,3);
  RVar2 = MINOR(this,0,2,3,1,2,3);
  RVar3 = MINOR(this,0,1,3,1,2,3);
  RVar4 = MINOR(this,0,1,2,1,2,3);
  RVar5 = MINOR(this,1,2,3,0,2,3);
  RVar6 = MINOR(this,0,2,3,0,2,3);
  RVar7 = MINOR(this,0,1,3,0,2,3);
  RVar8 = MINOR(this,0,1,2,0,2,3);
  RVar9 = MINOR(this,1,2,3,0,1,3);
  RVar10 = MINOR(this,0,2,3,0,1,3);
  RVar11 = MINOR(this,0,1,3,0,1,3);
  RVar12 = MINOR(this,0,1,2,0,1,3);
  RVar13 = MINOR(this,1,2,3,0,1,2);
  RVar14 = MINOR(this,0,2,3,0,1,2);
  RVar15 = MINOR(this,0,1,3,0,1,2);
  RVar16 = MINOR(this,0,1,2,0,1,2);
  __return_storage_ptr__->mState = UNKNOWN;
  (__return_storage_ptr__->field_1).m[0][0] = RVar1;
  (__return_storage_ptr__->field_1).m[0][1] = -RVar2;
  (__return_storage_ptr__->field_1).m[0][2] = RVar3;
  local_48 = SUB84(RVar4,0);
  uStack_44 = (uint)((ulong)RVar4 >> 0x20);
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_48;
  *(uint *)((long)&__return_storage_ptr__->field_1 + 0x1c) = uStack_44 ^ 0x80000000;
  *(int *)((long)&__return_storage_ptr__->field_1 + 0x20) = SUB84(RVar5,0);
  *(uint *)((long)&__return_storage_ptr__->field_1 + 0x24) =
       (uint)((ulong)RVar5 >> 0x20) ^ 0x80000000;
  (__return_storage_ptr__->field_1).m[1][1] = RVar6;
  (__return_storage_ptr__->field_1).m[1][2] = -RVar7;
  (__return_storage_ptr__->field_1).m[1][3] = RVar8;
  (__return_storage_ptr__->field_1).m[2][0] = RVar9;
  (__return_storage_ptr__->field_1).m[2][1] = -RVar10;
  (__return_storage_ptr__->field_1).m[2][2] = RVar11;
  local_88 = SUB84(RVar12,0);
  uStack_84 = (uint)((ulong)RVar12 >> 0x20);
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x58) = local_88;
  *(uint *)((long)&__return_storage_ptr__->field_1 + 0x5c) = uStack_84 ^ 0x80000000;
  *(int *)((long)&__return_storage_ptr__->field_1 + 0x60) = SUB84(RVar13,0);
  *(uint *)((long)&__return_storage_ptr__->field_1 + 100) =
       (uint)((ulong)RVar13 >> 0x20) ^ 0x80000000;
  (__return_storage_ptr__->field_1).m[3][1] = RVar14;
  (__return_storage_ptr__->field_1).m[3][2] = -RVar15;
  (__return_storage_ptr__->field_1).m[3][3] = RVar16;
  return __return_storage_ptr__;
}

Assistant:

Matrix4 Matrix4::adjoint() const
        {
            return Matrix4( MINOR( *this, 1, 2, 3, 1, 2, 3 ),
                            -MINOR( *this, 0, 2, 3, 1, 2, 3 ),
                            MINOR( *this, 0, 1, 3, 1, 2, 3 ),
                            -MINOR( *this, 0, 1, 2, 1, 2, 3 ),

                            -MINOR( *this, 1, 2, 3, 0, 2, 3 ),
                            MINOR( *this, 0, 2, 3, 0, 2, 3 ),
                            -MINOR( *this, 0, 1, 3, 0, 2, 3 ),
                            MINOR( *this, 0, 1, 2, 0, 2, 3 ),

                            MINOR( *this, 1, 2, 3, 0, 1, 3 ),
                            -MINOR( *this, 0, 2, 3, 0, 1, 3 ),
                            MINOR( *this, 0, 1, 3, 0, 1, 3 ),
                            -MINOR( *this, 0, 1, 2, 0, 1, 3 ),

                            -MINOR( *this, 1, 2, 3, 0, 1, 2 ),
                            MINOR( *this, 0, 2, 3, 0, 1, 2 ),
                            -MINOR( *this, 0, 1, 3, 0, 1, 2 ),
                            MINOR( *this, 0, 1, 2, 0, 1, 2 ) );
        }